

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::BeginTryExpr(Validator *this,TryExpr *expr)

{
  Opcode local_24;
  TryExpr *local_20;
  TryExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)46>).super_Expr.loc;
  local_20 = expr;
  expr_local = (TryExpr *)this;
  Opcode::Opcode(&local_24,Try);
  CheckBlockDeclaration
            (this,&(expr->super_ExprMixin<(wabt::ExprType)46>).super_Expr.loc,local_24,
             &(local_20->block).decl);
  TypeChecker::OnTry(&this->typechecker_,&(local_20->block).decl.sig.param_types,
                     &(local_20->block).decl.sig.result_types);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::BeginTryExpr(TryExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::Try, &expr->block.decl);
  typechecker_.OnTry(expr->block.decl.sig.param_types,
                     expr->block.decl.sig.result_types);
  return Result::Ok;
}